

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.hpp
# Opt level: O2

void __thiscall
libtest::printer::cprintf<char_const*,char_const*,char_const*>
          (printer *this,ansi_sgr *command,char *args,char *args_1,char *args_2)

{
  ostream *poVar1;
  allocator<char> local_99;
  string local_98;
  string local_78;
  ansi_sgr local_58;
  string local_50;
  
  poVar1 = this->os;
  ansi_sgr::to_string_abi_cxx11_(&local_50,command);
  std::operator<<(poVar1,(string *)&local_50);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,args,&local_99);
  printf<char_const*,char_const*>(this,&local_78,args_1,args_2);
  poVar1 = this->os;
  local_58.m_color = white;
  local_58.m_attr = reset;
  ansi_sgr::to_string_abi_cxx11_(&local_98,&local_58);
  std::operator<<(poVar1,(string *)&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void cprintf(const ansi_sgr& command, Args... args) { os << command.to_string(), printf(args...), os << ansi_sgr{}.to_string(); }